

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtr_mgr.c
# Opt level: O2

void set_status(rtr_mgr_config *conf,rtr_mgr_group *group,rtr_mgr_status mgr_status,
               rtr_socket *rtr_sock)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lrtr_dbg("RTR_MGR: Group(%u) status changed to: %s",(ulong)group->preference,
           mgr_str_status[mgr_status]);
  group->status = mgr_status;
  if (conf->status_fp == (rtr_mgr_status_fp)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    (*conf->status_fp)(group,mgr_status,rtr_sock,conf->status_fp_data);
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void set_status(const struct rtr_mgr_config *conf, struct rtr_mgr_group *group, enum rtr_mgr_status mgr_status,
		       const struct rtr_socket *rtr_sock)
{
	MGR_DBG("Group(%u) status changed to: %s", group->preference, rtr_mgr_status_to_str(mgr_status));

	group->status = mgr_status;
	if (conf->status_fp)
		conf->status_fp(group, mgr_status, rtr_sock, conf->status_fp_data);
}